

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall
soul::heart::Parser::scanBlocks(Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  pointer pBVar1;
  Module *pMVar2;
  bool bVar3;
  int iVar4;
  Identifier nm;
  PoolItem *pPVar5;
  pointer pBVar6;
  char *__s1;
  Identifier *in_R9;
  Identifier name;
  CodeLocation paramLocation;
  Identifier paramName;
  Type paramType;
  Identifier local_b0;
  Role local_a4;
  CodeLocation local_a0;
  vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
  *local_90;
  FunctionBuilder *local_88;
  FunctionParseState *local_80;
  pool_ref<soul::heart::Variable> local_78;
  Identifier local_70;
  CompileMessage local_68;
  
  local_90 = &state->blocks;
  local_88 = builder;
  local_80 = state;
  do {
    do {
      nm = parseBlockName(this);
      pBVar1 = (local_80->blocks).
               super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pBVar6 = (local_80->blocks).
                    super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
                    ._M_impl.super__Vector_impl_data._M_start; local_b0.name = nm.name,
          pBVar6 != pBVar1; pBVar6 = pBVar6 + 1) {
        if ((pBVar6->block->name).name == nm.name) {
          CompileMessageHelpers::createMessage<soul::Identifier&>
                    (&local_68,(CompileMessageHelpers *)0x1,none,0x27b770,(char *)&local_b0,in_R9);
          (*(this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser[2])(this,&local_68);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
            operator_delete(local_68.description._M_dataplus._M_p,
                            (ulong)(local_68.description.field_2._M_allocated_capacity + 1));
          }
        }
        nm.name = local_b0.name;
      }
      pPVar5 = PoolAllocator::allocateSpaceForObject
                         (&((local_88->super_BlockBuilder).module)->allocator->pool,0x78);
      Block::Block((Block *)&pPVar5->item,nm);
      pPVar5->destructor =
           PoolAllocator::allocate<soul::heart::Block,_soul::Identifier_&>::anon_class_1_0_00000001
           ::__invoke;
      bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x27f6d5);
      if ((bVar3) &&
         (bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matchIf<soul::TokenType>
                            (&this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                             ,(TokenType)0x27d2c7), !bVar3)) {
        do {
          readValueOrRefType((Type *)&local_68,this);
          local_a0.sourceCode.object =
               (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ).location.sourceCode.object;
          if (local_a0.sourceCode.object != (SourceCodeText *)0x0) {
            ((local_a0.sourceCode.object)->super_RefCountedObject).refCount =
                 ((local_a0.sourceCode.object)->super_RefCountedObject).refCount + 1;
          }
          local_a0.location.data =
               (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ).location.location.data;
          local_70 = parseVariableIdentifier(this);
          pMVar2 = (this->module).object;
          if (pMVar2 == (Module *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          local_a4 = parameter;
          local_78.object =
               PoolAllocator::
               allocate<soul::heart::Variable,soul::CodeLocation,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                         (&pMVar2->allocator->pool,&local_a0,(Type *)&local_68,&local_70,&local_a4);
          std::
          vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
          ::emplace_back<soul::pool_ref<soul::heart::Variable>>
                    ((vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
                      *)&pPVar5[1].item,&local_78);
          bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matchIf<soul::TokenType>
                            (&this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                             ,(TokenType)0x259fab);
          if (!bVar3) {
            Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::expect<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x27d2c7);
          }
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.sourceCode.object);
          RefCountedPtr<soul::Structure>::decIfNotNull
                    ((Structure *)local_68.description.field_2._M_allocated_capacity);
        } while (bVar3);
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x259478);
      local_68.description._M_string_length =
           (size_type)
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      local_68.description._M_dataplus._M_p = (pointer)&pPVar5->item;
      std::
      vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
      ::emplace_back<soul::FunctionParseState::BlockCode>(local_90,(BlockCode *)&local_68);
      skipPastNextOccurrenceOf(this,(TokenType)0x2585e7);
      __s1 = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).currentType.text;
    } while (__s1 == "$blockIdentifier");
    do {
      if ((__s1 != (char *)0x0) && (iVar4 = strcmp(__s1,"$blockIdentifier"), iVar4 == 0)) break;
      bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x258ac2);
      if (bVar3) {
        return;
      }
      skipPastNextOccurrenceOf(this,(TokenType)0x2585e7);
      __s1 = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).currentType.text;
    } while (__s1 != "$blockIdentifier");
  } while( true );
}

Assistant:

void scanBlocks (FunctionParseState& state, FunctionBuilder& builder)
    {
        for (;;)
        {
            auto name = parseBlockName();

            for (auto& b : state.blocks)
                if (b.block.name == name)
                    throwError (Errors::nameInUse (name));

            auto& block = builder.createBlock (name);

            if (matchIf (HEARTOperator::openParen))
            {
                if (! matchIf (HEARTOperator::closeParen))
                {
                    for (;;)
                    {
                        auto paramType = readValueOrRefType();
                        auto paramLocation = location;
                        auto paramName = parseVariableIdentifier();
                        block.parameters.push_back (module->allocate<heart::Variable> (std::move (paramLocation), paramType, paramName, heart::Variable::Role::parameter));

                        if (matchIf (HEARTOperator::comma))
                            continue;

                        expect (HEARTOperator::closeParen);
                        break;
                    }
                }
            }

            expect (HEARTOperator::colon);
            state.blocks.push_back ({ block, getCurrentTokeniserPosition() });

            skipPastNextOccurrenceOf (HEARTOperator::semicolon);

            while (! matches (Token::blockIdentifier))
            {
                if (matchIf (HEARTOperator::closeBrace))
                    return;

                skipPastNextOccurrenceOf (HEARTOperator::semicolon);
            }
        }
    }